

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::check_op(Parser *this)

{
  stack<Lex,_std::deque<Lex,_std::allocator<Lex>_>_> *this_00;
  lex_t lVar1;
  lex_t lVar2;
  lex_t lVar3;
  Exception *this_01;
  mapped_type *pmVar4;
  _Elt_pointer pLVar5;
  uint uVar6;
  lex_t operation;
  lex_t local_38;
  Lex local_34;
  
  this_00 = &this->lex_stack;
  pLVar5 = (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pLVar5 == (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pLVar5 = (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
  }
  lVar1 = Lex::get_type(pLVar5 + -1);
  std::deque<Lex,_std::allocator<Lex>_>::pop_back(&this_00->c);
  pLVar5 = (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pLVar5 == (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pLVar5 = (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
  }
  lVar2 = Lex::get_type(pLVar5 + -1);
  local_38 = lVar2;
  std::deque<Lex,_std::allocator<Lex>_>::pop_back(&this_00->c);
  pLVar5 = (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pLVar5 == (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pLVar5 = (this->lex_stack).c.super__Deque_base<Lex,_std::allocator<Lex>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
  }
  lVar3 = Lex::get_type(pLVar5 + -1);
  std::deque<Lex,_std::allocator<Lex>_>::pop_back(&this_00->c);
  if ((int)lVar3 < 9) {
    if (lVar3 == LEX_BOOL) {
      if ((lVar2 == LEX_OR) || (lVar2 == LEX_AND)) {
        lVar2 = LEX_BOOL;
        if (lVar1 == LEX_BOOL) {
LAB_0010bd84:
          Lex::Lex(&local_34,lVar2,0,0);
          std::deque<Lex,_std::allocator<Lex>_>::emplace_back<Lex>(&this_00->c,&local_34);
          Lex::~Lex(&local_34);
          Lex::Lex(&local_34,local_38,0,0);
          std::vector<Lex,_std::allocator<Lex>_>::emplace_back<Lex>
                    (&(this->prog).super_vector<Lex,_std::allocator<Lex>_>,&local_34);
          Lex::~Lex(&local_34);
          return;
        }
        this_01 = (Exception *)__cxa_allocate_exception(0x30);
        pmVar4 = std::
                 map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&Lex::lex_map_abi_cxx11_,&local_38);
        Exception::Exception(this_01,"Parser error: wrong type in operation: ",pmVar4);
      }
      else {
        this_01 = (Exception *)__cxa_allocate_exception(0x30);
        pmVar4 = std::
                 map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&Lex::lex_map_abi_cxx11_,&local_38);
        Exception::Exception(this_01,"Parser error: wrong type in operation: ",pmVar4);
      }
      goto LAB_0010bf0e;
    }
    if (lVar3 == LEX_INT) {
      uVar6 = lVar2 - LEX_EQ;
      if ((uVar6 < 0xd) && ((0x1ff9U >> (uVar6 & 0x1f) & 1) != 0)) {
        if (lVar1 == LEX_INT) {
          lVar2 = *(lex_t *)(&DAT_001150d4 + (ulong)uVar6 * 4);
          goto LAB_0010bd84;
        }
        this_01 = (Exception *)__cxa_allocate_exception(0x30);
        pmVar4 = std::
                 map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&Lex::lex_map_abi_cxx11_,&local_38);
        Exception::Exception(this_01,"Parser error: wrong type in operation: ",pmVar4);
      }
      else {
        this_01 = (Exception *)__cxa_allocate_exception(0x30);
        pmVar4 = std::
                 map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&Lex::lex_map_abi_cxx11_,&local_38);
        Exception::Exception(this_01,"Parser error: wrong type in operation: ",pmVar4);
      }
      goto LAB_0010bf0e;
    }
  }
  else if ((lVar3 == LEX_STRING) || (lVar3 == LEX_STRC)) {
    uVar6 = lVar2 - LEX_EQ;
    if ((uVar6 < 0xd) && ((0x1c71U >> (uVar6 & 0x1f) & 1) != 0)) {
      lVar2 = *(lex_t *)(&DAT_00115108 + (ulong)uVar6 * 4);
      if ((lVar1 == LEX_STRING) || (lVar1 == LEX_STRC)) goto LAB_0010bd84;
      this_01 = (Exception *)__cxa_allocate_exception(0x30);
      pmVar4 = std::
               map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Lex::lex_map_abi_cxx11_,&local_38);
      Exception::Exception(this_01,"Parser error: wrong type in operation: ",pmVar4);
    }
    else {
      this_01 = (Exception *)__cxa_allocate_exception(0x30);
      pmVar4 = std::
               map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Lex::lex_map_abi_cxx11_,&local_38);
      Exception::Exception(this_01,"Parser error: wrong type in operation: ",pmVar4);
    }
    goto LAB_0010bf0e;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x30);
  pmVar4 = std::
           map<lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<lex_t>,_std::allocator<std::pair<const_lex_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&Lex::lex_map_abi_cxx11_,&local_38);
  Exception::Exception(this_01,"Parser error: wrong operation: ",pmVar4);
LAB_0010bf0e:
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Parser::check_op() {
    lex_t operand1, operand2, operation, result_type;
    operand2 = lex_stack.top().get_type();
    lex_stack.pop();
    operation = lex_stack.top().get_type();
    lex_stack.pop();
    operand1 = lex_stack.top().get_type();
    lex_stack.pop();

    if(operand1 == LEX_INT){
        if(operation == LEX_PLUS || operation == LEX_MINUS ||
                operation == LEX_TIMES || operation == LEX_SLASH || operation == LEX_ASSIGN){
            result_type = LEX_INT;
        } else if ( operation == LEX_EQ || operation == LEX_LSS || operation == LEX_GTR ||
                    operation == LEX_LEQ || operation == LEX_GEQ || operation == LEX_NEQ ){
            result_type = LEX_BOOL;
        } else throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
        if (operand1 != operand2)
            throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
    } else if(operand1 == LEX_BOOL){
        if(operation == LEX_OR || operation == LEX_AND){
            result_type = LEX_BOOL;
        } else throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
        if (operand1 != operand2)
            throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
    } else if(operand1 == LEX_STRING || operand1 == LEX_STRC){
        if(operation == LEX_PLUS){
            result_type = LEX_STRING;
        } else if(operation == LEX_EQ || operation == LEX_LSS || operation == LEX_GTR ||
                  operation == LEX_LEQ || operation == LEX_GEQ || operation == LEX_NEQ){
            result_type = LEX_BOOL;
        } else throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
        if (operand2 != LEX_STRING && operand2 != LEX_STRC)
            throw Exception("Parser error: wrong type in operation: ", Lex::lex_map[operation]);
    } else throw Exception("Parser error: wrong operation: ", Lex::lex_map[operation]);
    lex_stack.push(result_type);
    prog.push_back(operation);

}